

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evp_compat.c
# Opt level: O1

char * old_create_filter_action_spec(CMFormatList format_list,char *function)

{
  FMFieldList list;
  int iVar1;
  CMFormatList pCVar2;
  FMStructDescList format_list_00;
  char *pcVar3;
  long lVar4;
  ulong uVar5;
  uint uVar6;
  
  uVar6 = 0;
  for (pCVar2 = format_list;
      (format_list != (CMFormatList)0x0 && (pCVar2->format_name != (char *)0x0));
      pCVar2 = pCVar2 + 1) {
    uVar6 = uVar6 + 1;
  }
  uVar5 = (ulong)uVar6;
  pcVar3 = function;
  format_list_00 = (FMStructDescList)INT_CMmalloc(uVar5 * 0x20 + 0x20);
  if (uVar6 != 0) {
    lVar4 = 0;
    do {
      *(undefined8 *)((long)&format_list_00->format_name + lVar4 * 2) =
           *(undefined8 *)((long)&format_list->format_name + lVar4);
      list = *(FMFieldList *)((long)&format_list->field_list + lVar4);
      *(FMFieldList *)((long)&format_list_00->field_list + lVar4 * 2) = list;
      iVar1 = struct_size_field_list(list,(int)pcVar3);
      *(int *)((long)&format_list_00->struct_size + lVar4 * 2) = iVar1;
      *(undefined8 *)((long)&format_list_00->opt_info + lVar4 * 2) = 0;
      lVar4 = lVar4 + 0x10;
    } while (uVar5 << 4 != lVar4);
  }
  format_list_00[uVar5].format_name = (char *)0x0;
  format_list_00[uVar5].field_list = (FMFieldList)0x0;
  pcVar3 = create_filter_action_spec(format_list_00,function);
  return pcVar3;
}

Assistant:

extern char *
old_create_filter_action_spec(CMFormatList format_list, char *function)
{
    FMStructDescList structs;
    int count = 0, i;
    while (format_list && (format_list[count].format_name != NULL)) count++;
    structs = malloc(sizeof(structs[0]) * (count + 1));
    for (i = 0; i < count; i++) {
	structs[i].format_name = format_list[i].format_name;
	structs[i].field_list = format_list[i].field_list;
	structs[i].struct_size = struct_size_field_list(structs[i].field_list, (int)sizeof(char*));
	structs[i].opt_info = NULL;
    }
    structs[count].format_name = NULL;
    structs[count].field_list = NULL;
    return create_filter_action_spec(structs, function);
}